

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.h
# Opt level: O0

void __thiscall OSS_Watchdog::thread_main(OSS_Watchdog *this)

{
  int iVar1;
  __pid_t _Var2;
  clock_t cVar3;
  time_t tVar4;
  watchdog_stats *pwVar5;
  watchdog_stats *pwVar6;
  long lVar7;
  OSS_Watchdog *in_RDI;
  double dVar8;
  time_t time_since_net;
  double cpu_pct;
  watchdog_stats *prv;
  watchdog_stats *cur;
  
  oss_debug_log("watchdog thread started");
  while (iVar1 = OS_Waitable::test((OS_Waitable *)0x24f5f1), iVar1 == 0) {
    _Var2 = OS_Waitable::wait(&quit_evt->super_OS_Waitable,(void *)0x2710);
    if (_Var2 == -1) {
      cVar3 = clock();
      in_RDI->stats[in_RDI->idx].cpu_time = cVar3 / 1000000;
      tVar4 = time((time_t *)0x0);
      in_RDI->stats[in_RDI->idx].wall_time = tVar4;
      in_RDI->cnt = in_RDI->cnt + 1;
      iVar1 = in_RDI->idx + 1;
      in_RDI->idx = iVar1;
      if (9 < iVar1) {
        in_RDI->idx = 0;
      }
      if (6 < in_RDI->cnt) {
        pwVar5 = get_stats(in_RDI,0);
        pwVar6 = get_stats(in_RDI,6);
        dVar8 = (double)(pwVar5->cpu_time - pwVar6->cpu_time) /
                (double)(pwVar5->wall_time - pwVar6->wall_time);
        lVar7 = pwVar5->wall_time - OS_CoreSocket::last_incoming_time;
        if (0.4 <= dVar8) {
          oss_debug_log("watchdog terminating process due to high CPU usage (cpu_pct = %0.2ld%%)",
                        dVar8);
          _Var2 = getpid();
          kill(_Var2,9);
        }
        if (0x168 < lVar7) {
          oss_debug_log("watchdog terminating process due to network inactivity (time_since_net = %ld seconds)"
                        ,lVar7);
          _Var2 = getpid();
          kill(_Var2,9);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void thread_main()
    {
        oss_debug_log("watchdog thread started");
        
        /* loop until our 'quit' event has fired */
        while (!quit_evt->test())
        {
            /* wake up every 10 seconds, or when the 'quit' event fires */
            if (quit_evt->wait(10000) == OSWAIT_TIMEOUT)
            {
                /* 
                 *   That timed out, so it's time for another watchdog check.
                 *   First, update the timers. 
                 */
                stats[idx].cpu_time = clock() / CLOCKS_PER_SEC;
                stats[idx].wall_time = time(0);

                /* bump the statistics counters */
                ++cnt;
                if (++idx >= NSTATS)
                    idx = 0;

                /* 
                 *   If we've collected enough statistics, do our checks.  We
                 *   need at least 60 seconds of trailing data, and we wake
                 *   up every 10 seconds, so we need at least seven samples
                 *   (#0 is 0 seconds ago, #1 is 10 seconds ago, ... #6 is 60
                 *   seconds ago, hence we need 0-6 = 7 samples).
                 */
                if (cnt >= 7)
                {
                    /* get the last and the 60-seconds-ago stats */
                    const watchdog_stats *cur = get_stats(0);
                    const watchdog_stats *prv = get_stats(6);

                    /* calculate the percentage of CPU time */
                    double cpu_pct = ((double)(cur->cpu_time - prv->cpu_time))
                                     / (cur->wall_time - prv->wall_time);

                    /* calculate the time since the last network event */
                    time_t time_since_net =
                        cur->wall_time - OS_CoreSocket::last_incoming_time;

                    /*
                     *   Check for termination conditions:
                     *   
                     *   1.  If we've consumed 40% or higher CPU over the
                     *   last minute, we're probably stuck in a loop; we
                     *   might also be running an intentionally
                     *   compute-intensive program, which isn't a bug but is
                     *   an abuse of a shared server, so in either case kill
                     *   the program.  (We're not worried about short bursts
                     *   of high CPU usage, which is why we average over a
                     *   fairly long real-time period.)
                     *   
                     *   2.  If we haven't seen any incoming network activity
                     *   in 6 minutes, the program is probably idle and
                     *   should probably have noticed that and shut itself
                     *   down already, so it might have a bug in its internal
                     *   inactivity monitor.  It could also be intentionally
                     *   running as a continuous service, but that's abusive
                     *   on a shared server because it uses memory that's
                     *   meant to be shared.  In either case, shut it down.
                     */
                    if (cpu_pct >= 0.4)
                    {
                        oss_debug_log("watchdog terminating process due to "
                                      "high CPU usage (cpu_pct = %0.2ld%%)",
                                      cpu_pct);
                        kill(getpid(), 9);
                    }
                    if (time_since_net > 6*60)
                    {
                        oss_debug_log("watchdog terminating process due to "
                                      "network inactivity (time_since_net"
                                      " = %ld seconds)", (long)time_since_net);
                        kill(getpid(), 9);
                    }
                }
            }
        }
    }